

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderBuiltinVarTests::init(ShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  char *__s;
  char *desc;
  Context *pCVar1;
  int extraout_EAX;
  ShaderBuiltinConstantCase *pSVar2;
  ShaderDepthRangeTest *pSVar3;
  VertexIDCase *this_00;
  TestNode *pTVar4;
  long lVar5;
  allocator<char> local_91;
  ShaderBuiltinConstantCase *local_90;
  TestNode *local_88;
  GetConstantValueFunc local_80;
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar5 = 0x10;
  local_88 = (TestNode *)this;
  while (lVar5 != 0x118) {
    __s = *(char **)((long)&PTR_iterate_00c0c000 + lVar5);
    desc = *(char **)(&UNK_00c0c008 + lVar5);
    local_80 = *(GetConstantValueFunc *)((long)&init::builtinConstants[0].caseName + lVar5);
    local_90 = (ShaderBuiltinConstantCase *)operator_new(0xa8);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_91);
    local_78 = lVar5;
    std::operator+(&local_70,&local_50,"_vertex");
    pSVar2 = local_90;
    ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
              (local_90,pCVar1,local_70._M_dataplus._M_p,desc,desc,local_80,SHADERTYPE_VERTEX);
    pTVar4 = local_88;
    tcu::TestNode::addChild(local_88,(TestNode *)pSVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pSVar2 = (ShaderBuiltinConstantCase *)operator_new(0xa8);
    pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_91);
    std::operator+(&local_70,&local_50,"_fragment");
    ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
              (pSVar2,pCVar1,local_70._M_dataplus._M_p,desc,desc,local_80,SHADERTYPE_FRAGMENT);
    this = (ShaderBuiltinVarTests *)local_88;
    tcu::TestNode::addChild(local_88,(TestNode *)pSVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar5 = local_78 + 0x18;
  }
  pSVar3 = (ShaderDepthRangeTest *)operator_new(0x150);
  ShaderDepthRangeTest::ShaderDepthRangeTest
            (pSVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "depth_range_vertex","gl_DepthRange",true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pSVar3 = (ShaderDepthRangeTest *)operator_new(0x150);
  ShaderDepthRangeTest::ShaderDepthRangeTest
            (pSVar3,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "depth_range_fragment","gl_DepthRange",false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  this_00 = (VertexIDCase *)operator_new(200);
  VertexIDCase::VertexIDCase(this_00,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar4 = (TestNode *)operator_new(0x78);
  FragCoordXYZCase::FragCoordXYZCase
            ((FragCoordXYZCase *)pTVar4,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x78);
  FragCoordWCase::FragCoordWCase
            ((FragCoordWCase *)pTVar4,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x78);
  PointCoordCase::PointCoordCase
            ((PointCoordCase *)pTVar4,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x78);
  FrontFacingCase::FrontFacingCase
            ((FrontFacingCase *)pTVar4,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  return extraout_EAX;
}

Assistant:

void ShaderBuiltinVarTests::init (void)
{
	// Builtin constants.

	static const struct
	{
		const char*											caseName;
		const char*											varName;
		ShaderBuiltinConstantCase::GetConstantValueFunc		getValue;
	} builtinConstants[] =
	{
		// GLES 2.

		{ "max_vertex_attribs",					"gl_MaxVertexAttribs",				getInteger<GL_MAX_VERTEX_ATTRIBS>						},
		{ "max_vertex_uniform_vectors",			"gl_MaxVertexUniformVectors",		getInteger<GL_MAX_VERTEX_UNIFORM_VECTORS>				},
		{ "max_fragment_uniform_vectors",		"gl_MaxFragmentUniformVectors",		getInteger<GL_MAX_FRAGMENT_UNIFORM_VECTORS>				},
		{ "max_texture_image_units",			"gl_MaxTextureImageUnits",			getInteger<GL_MAX_TEXTURE_IMAGE_UNITS>					},
		{ "max_vertex_texture_image_units",		"gl_MaxVertexTextureImageUnits",	getInteger<GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS>			},
		{ "max_combined_texture_image_units",	"gl_MaxCombinedTextureImageUnits",	getInteger<GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS>			},
		{ "max_draw_buffers",					"gl_MaxDrawBuffers",				getInteger<GL_MAX_DRAW_BUFFERS>							},

		// GLES 3.

		{ "max_vertex_output_vectors",			"gl_MaxVertexOutputVectors",		getVectorsFromComps<GL_MAX_VERTEX_OUTPUT_COMPONENTS>	},
		{ "max_fragment_input_vectors",			"gl_MaxFragmentInputVectors",		getVectorsFromComps<GL_MAX_FRAGMENT_INPUT_COMPONENTS>	},
		{ "min_program_texel_offset",			"gl_MinProgramTexelOffset",			getInteger<GL_MIN_PROGRAM_TEXEL_OFFSET>					},
		{ "max_program_texel_offset",			"gl_MaxProgramTexelOffset",			getInteger<GL_MAX_PROGRAM_TEXEL_OFFSET>					}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(builtinConstants); ndx++)
	{
		const char* const										caseName	= builtinConstants[ndx].caseName;
		const char* const										varName		= builtinConstants[ndx].varName;
		const ShaderBuiltinConstantCase::GetConstantValueFunc	getValue	= builtinConstants[ndx].getValue;

		addChild(new ShaderBuiltinConstantCase(m_context, (string(caseName) + "_vertex").c_str(),	varName, varName, getValue, glu::SHADERTYPE_VERTEX));
		addChild(new ShaderBuiltinConstantCase(m_context, (string(caseName) + "_fragment").c_str(),	varName, varName, getValue, glu::SHADERTYPE_FRAGMENT));
	}

	addChild(new ShaderDepthRangeTest(m_context, "depth_range_vertex",		"gl_DepthRange", true));
	addChild(new ShaderDepthRangeTest(m_context, "depth_range_fragment",	"gl_DepthRange", false));

	// Vertex shader builtin variables.
	addChild(new VertexIDCase		(m_context));
	// \todo [2013-03-20 pyry] gl_InstanceID -- tested in instancing tests quite thoroughly.

	// Fragment shader builtin variables.

	addChild(new FragCoordXYZCase	(m_context));
	addChild(new FragCoordWCase		(m_context));
	addChild(new PointCoordCase		(m_context));
	addChild(new FrontFacingCase	(m_context));
}